

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeImpl.cpp
# Opt level: O2

DOMNode * __thiscall
xercesc_4_0::DOMNodeImpl::replaceChild(DOMNodeImpl *this,DOMNode *param_1,DOMNode *param_2)

{
  DOMException *this_00;
  DOMDocument *pDVar1;
  DOMNode *pDVar2;
  
  this_00 = (DOMException *)__cxa_allocate_exception(0x28);
  pDVar1 = getOwnerDocument(this);
  if (pDVar1 == (DOMDocument *)0x0) {
    pDVar2 = (DOMNode *)&XMLPlatformUtils::fgMemoryManager;
  }
  else {
    pDVar1 = getOwnerDocument(this);
    pDVar2 = &pDVar1[10].super_DOMNode;
  }
  DOMException::DOMException(this_00,3,0,(MemoryManager *)pDVar2->_vptr_DOMNode);
  __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

DOMNode *DOMNodeImpl::replaceChild(DOMNode *, DOMNode *)
{
    throw DOMException(DOMException::HIERARCHY_REQUEST_ERR,0, GetDOMNodeMemoryManager);
    return 0;
}